

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

bool __thiscall State::AddDefault(State *this,StringPiece path,string *err)

{
  pointer *pppNVar1;
  iterator __position;
  const_iterator cVar2;
  long *plVar3;
  long *plVar4;
  size_t sVar5;
  char *pcVar6;
  Node *pNVar7;
  Node *node;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  Node *local_58;
  key_type local_50;
  long local_40;
  long lStack_38;
  
  sVar5 = path.len_;
  pcVar6 = path.str_;
  local_50.str_ = pcVar6;
  local_50.len_ = sVar5;
  cVar2 = std::
          _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,&local_50);
  if (cVar2.super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>._M_cur ==
      (__node_type *)0x0) {
    pNVar7 = (Node *)0x0;
  }
  else {
    pNVar7 = *(Node **)((long)cVar2.
                              super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>.
                              _M_cur + 0x18);
  }
  local_58 = pNVar7;
  if (pNVar7 == (Node *)0x0) {
    local_98 = &local_88;
    if (sVar5 == 0) {
      local_90 = 0;
      local_88 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar6,pcVar6 + sVar5);
    }
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x127e9f);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_68 = *plVar4;
      lStack_60 = plVar3[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar4;
      local_78 = (long *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_40 = *plVar4;
      lStack_38 = plVar3[3];
      local_50.str_ = (char *)&local_40;
    }
    else {
      local_40 = *plVar4;
      local_50.str_ = (char *)*plVar3;
    }
    local_50.len_ = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)&local_50);
    if ((long *)local_50.str_ != &local_40) {
      operator_delete(local_50.str_,local_40 + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
    }
  }
  else {
    __position._M_current =
         (this->defaults_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->defaults_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                ((vector<Node*,std::allocator<Node*>> *)&this->defaults_,__position,&local_58);
    }
    else {
      *__position._M_current = pNVar7;
      pppNVar1 = &(this->defaults_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
  }
  return pNVar7 != (Node *)0x0;
}

Assistant:

bool State::AddDefault(StringPiece path, string* err) {
  Node* node = LookupNode(path);
  if (!node) {
    *err = "unknown target '" + path.AsString() + "'";
    return false;
  }
  defaults_.push_back(node);
  return true;
}